

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfwht_gray.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
pow2Vector<double>(vector<double,_std::allocator<double>_> *__return_storage_ptr__,size_t k)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  size_t i;
  size_type sVar4;
  size_type __n;
  double dVar5;
  mt19937_64 gen;
  random_device rd;
  allocator_type local_1d89;
  vector<double,_std::allocator<double>_> local_1d88;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_1d70;
  random_device local_13a8;
  
  std::random_device::random_device(&local_13a8);
  uVar1 = std::random_device::_M_getval();
  local_1d70._M_x[0] = (unsigned_long)uVar1;
  lVar2 = 1;
  uVar3 = local_1d70._M_x[0];
  do {
    uVar3 = (uVar3 >> 0x3e ^ uVar3) * 0x5851f42d4c957f2d + lVar2;
    local_1d70._M_x[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x138);
  local_1d70._M_p = 0x138;
  __n = 1L << ((byte)k & 0x3f);
  std::vector<double,_std::allocator<double>_>::vector(&local_1d88,__n,&local_1d89);
  sVar4 = 0;
  do {
    dVar5 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                      (&local_1d70);
    local_1d88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[sVar4] = dVar5 + 0.0;
    sVar4 = sVar4 + 1;
  } while (__n != sVar4);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_1d88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_1d88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1d88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  std::random_device::_M_fini();
  return __return_storage_ptr__;
}

Assistant:

auto pow2Vector( const size_t k ) {

  // random entries
  std::random_device                rd ;
  std::mt19937_64                   gen( rd() ) ;
  std::uniform_real_distribution<>  dis( 0.0, 1.0 ) ;

  // generate vector
  std::vector< T > v( size_t(1)<<k ) ;
  for ( size_t i = 0; i < (size_t(1)<<k); i++ ) {
    v[i] = dis(gen) ;
  }

  return v ;
}